

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.cpp
# Opt level: O2

bool __thiscall ser::Savepoint::operator<(Savepoint *this,Savepoint *other)

{
  bool bVar1;
  
  bVar1 = std::operator!=(&this->name_,&other->name_);
  if (bVar1) {
    bVar1 = std::operator<(&this->name_,&other->name_);
    return bVar1;
  }
  bVar1 = MetainfoSet::operator<(&this->metainfo_,&other->metainfo_);
  return bVar1;
}

Assistant:

bool Savepoint::operator<(const Savepoint& other) const
{
    if (name_ != other.name_)
        return name_ < other.name_;

    return metainfo_ < other.metainfo_;
}